

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZ77.cpp
# Opt level: O3

void __thiscall Lz77Encoder::run(Lz77Encoder *this)

{
  char cVar1;
  char cVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  uint uVar5;
  ostream *poVar6;
  Lz77Node *node;
  ulong uVar7;
  undefined1 *puVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  value_type symbol;
  int amount;
  int shift;
  vector<Lz77Node,_std::allocator<Lz77Node>_> table;
  stringstream out;
  char local_265;
  uint local_264;
  int local_260;
  uint local_25c;
  int local_258;
  int local_254;
  long *local_250 [2];
  long local_240 [2];
  ulong local_230;
  undefined1 *local_228;
  undefined1 *puStack_220;
  long local_218;
  ulong local_208;
  ulong local_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8;
  ulong local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"LZ77 encryption...",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  local_228 = (undefined1 *)0x0;
  puStack_220 = (undefined1 *)0x0;
  local_218 = 0;
  local_264 = 0;
  while( true ) {
    pcVar3 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar3,
               pcVar3 + (this->super_Cryptor).in_message_._M_string_length);
    uVar7 = local_1b0;
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    uVar9 = (ulong)local_264;
    if (uVar7 <= uVar9) break;
    local_25c = 0;
    local_258 = 0;
    pcVar3 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar3,
               pcVar3 + (this->super_Cryptor).in_message_._M_string_length);
    cVar1 = *(char *)((long)local_1b8 + uVar9);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    uVar7 = (ulong)local_264;
    uVar10 = local_264;
    local_265 = cVar1;
    do {
      local_230 = (ulong)uVar10;
      local_254 = local_264 - uVar10;
      uVar10 = 0;
      local_260 = 0;
      local_208 = uVar7;
      while( true ) {
        local_1b8 = local_1a8;
        pcVar3 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,pcVar3,
                   pcVar3 + (this->super_Cryptor).in_message_._M_string_length);
        uVar9 = (ulong)((int)uVar7 + uVar10);
        local_200 = uVar9;
        if (uVar9 < local_1b0) {
          local_250[0] = local_240;
          pcVar3 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_250,pcVar3,
                     pcVar3 + (this->super_Cryptor).in_message_._M_string_length);
          cVar1 = *(char *)((long)local_250[0] + uVar9);
          pcVar3 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
          local_1f8[0] = local_1e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1f8,pcVar3,
                     pcVar3 + (this->super_Cryptor).in_message_._M_string_length);
          uVar5 = (int)local_230 + uVar10;
          cVar2 = *(char *)((long)local_1f8[0] + (ulong)uVar5);
          bVar11 = uVar5 < local_264;
          if (local_1f8[0] != local_1e8) {
            operator_delete(local_1f8[0],local_1e8[0] + 1);
          }
          if (local_250[0] != local_240) {
            operator_delete(local_250[0],local_240[0] + 1);
          }
          bVar11 = cVar1 == cVar2 && bVar11;
          uVar7 = local_208;
        }
        else {
          bVar11 = false;
        }
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8,local_1a8[0] + 1);
        }
        if (!bVar11) break;
        uVar10 = uVar10 + 1;
        if (local_260 == 0) {
          local_260 = local_254;
        }
      }
      uVar7 = (ulong)local_264;
      if (3 < uVar10 && (int)local_25c < (int)uVar10) {
        local_258 = local_260;
        uVar7 = local_200;
        local_25c = uVar10;
      }
      uVar5 = local_25c;
      uVar10 = (int)local_230 - 1;
    } while ((int)local_230 != 0);
    pcVar3 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar3,
               pcVar3 + (this->super_Cryptor).in_message_._M_string_length);
    uVar5 = uVar5 + local_264;
    local_265 = *(char *)((long)local_1b8 + (ulong)uVar5);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    std::vector<Lz77Node,std::allocator<Lz77Node>>::emplace_back<char&,int&,int&>
              ((vector<Lz77Node,std::allocator<Lz77Node>> *)&local_228,&local_265,&local_258,
               (int *)&local_25c);
    local_264 = uVar5 + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  puVar4 = puStack_220;
  if (local_228 != puStack_220) {
    puVar8 = local_228;
    do {
      if ((*(int *)(puVar8 + 4) != 0) && (*(int *)(puVar8 + 8) != 0)) {
        local_250[0]._0_1_ = (string)0x5b;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_250,1);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,*(int *)(puVar8 + 4));
        local_250[0]._0_1_ = (string)0x2c;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_250,1);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,*(int *)(puVar8 + 8));
        local_250[0] = (long *)CONCAT71(local_250[0]._1_7_,0x5d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_250,1);
        std::ostream::flush();
      }
      local_250[0] = (long *)CONCAT71(local_250[0]._1_7_,*puVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)local_250,1);
      std::ostream::flush();
      puVar8 = puVar8 + 0xc;
    } while (puVar8 != puVar4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&(this->super_Cryptor).out_message_,(string *)local_1d8)
  ;
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"encryption done!",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_228 != (undefined1 *)0x0) {
    operator_delete(local_228,local_218 - (long)local_228);
  }
  return;
}

Assistant:

void Lz77Encoder::run() {
  cout << "LZ77 encryption..." << endl;

  //iterate through message & write it into table
  vector<Lz77Node> table;
  for (unsigned int i = 0; i < get_in_message().length(); i++) {

    //initial data
    auto amount = 0;
    auto shift = 0;
    auto initial_i = i;
    auto symbol = get_in_message()[i];

    //iterate through encoded sequence
    for (auto j = i; ; j--) {

      auto temp_amount = 0;
      auto temp_shift = 0;
      auto initial_j = j;

      while (initial_i < get_in_message().length() &&
        get_in_message()[initial_i] == get_in_message()[initial_j] &&
        initial_j < i) {

        initial_i++;
        initial_j++;
        temp_amount++;

        if (temp_shift == 0) {
          //relative offset
          temp_shift = i - j;
        }
      }

      //no reason to refer if repetition is less than 4 chars
      if (temp_amount > amount && temp_amount > 3) {
        amount = temp_amount;
        shift = temp_shift;
      }
      else {
        initial_i = i;
      }

      if (j == 0)
      {
        break;
      }
    }

    i += amount;
    symbol = get_in_message()[i];
    table.emplace_back(symbol, shift, amount);
  }

  stringstream out;
  for (auto& node : table) {
    if (node.get_offset() != 0 && node.get_amount() != 0) {
      out << LEFT_BREAK << node.get_offset() << SEPARATOR << node.get_amount() << RIGHT_BREAK << flush;
    }
    out << node.get_symbol() << flush;
  }
  set_out_message(out.str());

  cout << "encryption done!" << endl;
}